

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

string * __thiscall
backward::details::demangler_impl<backward::system_tag::linux_tag>::demangle_abi_cxx11_
          (string *__return_storage_ptr__,demangler_impl<backward::system_tag::linux_tag> *this,
          char *funcname)

{
  char *__s;
  size_t sVar1;
  allocator local_21;
  
  __s = (char *)__cxa_demangle(funcname,(this->_demangle_buffer)._val,&this->_demangle_buffer_length
                               ,0);
  if (__s == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,funcname,&local_21);
  }
  else {
    (this->_demangle_buffer)._val = __s;
    (this->_demangle_buffer)._empty = false;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char *funcname) {
    using namespace details;
    char *result = abi::__cxa_demangle(funcname, _demangle_buffer.get(),
                                       &_demangle_buffer_length, nullptr);
    if (result) {
      _demangle_buffer.update(result);
      return result;
    }
    return funcname;
  }